

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O2

void __thiscall xmrig::CudaBackend::setJob(CudaBackend *this,Job *job)

{
  CudaLaunchData *__first1;
  CudaLaunchData *__last1;
  bool bVar1;
  int iVar2;
  Config *this_00;
  CudaConfig *this_01;
  Miner *miner;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> threads;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  this_01 = Config::cuda(this_00);
  if (this_01->m_enabled == true) {
    CudaBackendPrivate::init(this->d_ptr,(EVP_PKEY_CTX *)this_01);
  }
  iVar2 = (*(this->super_IBackend)._vptr_IBackend[2])(this);
  if ((char)iVar2 != '\0') {
    miner = Controller::miner(this->d_ptr->controller);
    CudaConfig::get(&threads,this_01,miner,&this->d_ptr->devices);
    __first1 = (this->d_ptr->threads).
               super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start;
    __last1 = (this->d_ptr->threads).
              super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (((__first1 == __last1) ||
        ((long)__last1 - (long)__first1 !=
         (long)threads.
               super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)threads.
               super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start)) ||
       (bVar1 = std::__equal<false>::equal<xmrig::CudaLaunchData*,xmrig::CudaLaunchData*>
                          (__first1,__last1,
                           threads.
                           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>
                           ._M_impl.super__Vector_impl_data._M_start), !bVar1)) {
      if (threads.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          threads.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        Log::print(WARNING,
                   "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m"
                   ,"\x1b[42;1m\x1b[1;37m nv  \x1b[0m");
        (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
      }
      else {
        (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
        std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::_M_move_assign
                  (&this->d_ptr->threads,&threads);
        CudaBackendPrivate::start(this->d_ptr,job);
      }
    }
    std::_Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::~_Vector_base
              (&threads.
                super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>);
    return;
  }
  (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
  return;
}

Assistant:

void xmrig::CudaBackend::setJob(const Job &job)
{
    const auto &cuda = d_ptr->controller->config()->cuda();
    if (cuda.isEnabled()) {
        d_ptr->init(cuda);
    }

    if (!isEnabled()) {
        return stop();
    }

    auto threads = cuda.get(d_ptr->controller->miner(), d_ptr->devices);
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start(job);
}